

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

Attribute __thiscall
cali::Caliper::create_attribute
          (Caliper *this,string *name,cali_attr_type type,int prop,int n_meta,Attribute *meta_attr,
          Variant *meta_val)

{
  ThreadData *this_00;
  GlobalData *pGVar1;
  _Base_ptr __n;
  pointer pcVar2;
  pointer pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  cali_variant_t *pcVar6;
  _Bool _Var7;
  int iVar8;
  iterator iVar9;
  Node *pNVar10;
  iterator iVar11;
  long lVar12;
  Attribute AVar13;
  ulong uVar14;
  pthread_mutex_t *__mutex;
  Node *pNVar15;
  Channel *channel;
  pointer pCVar16;
  ulong uVar17;
  _Rb_tree_color _Var18;
  cali_variant_t lhs;
  cali_variant_t rhs;
  Attribute name_attr;
  Attribute prop_attr;
  Attribute local_80;
  pthread_mutex_t *local_78;
  ThreadData *local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>
  local_68;
  Attribute local_40;
  Attribute local_38;
  
  __mutex = (pthread_mutex_t *)this->sG;
  if (__mutex == (pthread_mutex_t *)0x0) {
    __assert_fail("sG != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/Caliper.cpp"
                  ,0x2a4,
                  "virtual Attribute cali::Caliper::create_attribute(const std::string &, cali_attr_type, int, int, const Attribute *, const Variant *)"
                 );
  }
  local_70 = this->sT;
  (local_70->lock).m_lock = (local_70->lock).m_lock + 1;
  iVar8 = pthread_mutex_lock(__mutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
          ::find(&(this->sG->attribute_map)._M_t,name);
  if ((_Rb_tree_header *)iVar9._M_node ==
      &(this->sG->attribute_map)._M_t._M_impl.super__Rb_tree_header) {
    pthread_mutex_unlock(__mutex);
    pNVar10 = *(Node **)((long)internal::MetadataTree::mG._M_b._M_p + 0x78 + (ulong)type * 8);
    if (0 < n_meta) {
      uVar17 = (ulong)(uint)n_meta;
      do {
        pNVar10 = internal::MetadataTree::get_child(&this->sT->tree,meta_attr,meta_val,pNVar10);
        meta_val = meta_val + 1;
        meta_attr = meta_attr + 1;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    iVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&(this->sG->attribute_prop_presets)._M_t,name);
    if ((_Rb_tree_header *)iVar11._M_node !=
        &(this->sG->attribute_prop_presets)._M_t._M_impl.super__Rb_tree_header) {
      prop = iVar11._M_node[2]._M_color;
    }
    _Var18 = prop & 0xfffffbc3 | 0x40c;
    if (((uint)prop >> 9 & 1) == 0) {
      _Var18 = prop;
    }
    pNVar15 = pNVar10;
    if ((_Var18 & 0x3c) == _S_red) {
      _Var18 = _Var18 | this->sG->attribute_default_scope;
    }
    for (; pNVar15 != (Node *)0x0;
        pNVar15 = *(Node **)((long)&(((pNVar15->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                    super_LockfreeIntrusiveTree<cali::Node>).m_me +
                            (pNVar15->super_LockfreeIntrusiveTree<cali::Node>).m_node)) {
      if (((pNVar15->m_attribute == cali_class_aggregatable_attr_id) &&
          ((pNVar15->m_data).m_v.type_and_size == 7)) &&
         (lhs.value.v_uint = (pNVar15->m_data).m_v.value.v_uint, lhs.type_and_size = 7,
         rhs.value.v_uint = 1, rhs.type_and_size = 7, _Var7 = _cali_variant_value_eq(lhs,rhs), _Var7
         )) {
        _Var18 = _Var18 | 0x800;
        break;
      }
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x70);
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(8);
    uVar17 = SUB168(auVar5 / auVar4,0);
    uVar14 = SUB168(auVar5 % auVar4,0);
    pNVar15 = (Node *)0x0;
    if (uVar17 < *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x68)) {
      lVar12 = uVar17 * 0x10;
      if (uVar14 < *(ulong *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) + 8 +
                             lVar12)) {
        pNVar15 = (Node *)(uVar14 * 0x48 +
                          *(long *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) +
                                   lVar12));
      }
      else {
        pNVar15 = (Node *)0x0;
      }
    }
    local_40 = Attribute::make_attribute(pNVar15);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x70);
    auVar4 = ZEXT816(0) << 0x40 | ZEXT816(10);
    uVar17 = SUB168(auVar4 / auVar5,0);
    uVar14 = SUB168(auVar4 % auVar5,0);
    pNVar15 = (Node *)0x0;
    if (uVar17 < *(ulong *)((long)internal::MetadataTree::mG._M_b._M_p + 0x68)) {
      lVar12 = uVar17 * 0x10;
      if (uVar14 < *(ulong *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) + 8 +
                             lVar12)) {
        pNVar15 = (Node *)(uVar14 * 0x48 +
                          *(long *)(*(long *)((long)internal::MetadataTree::mG._M_b._M_p + 0x60) +
                                   lVar12));
      }
      else {
        pNVar15 = (Node *)0x0;
      }
    }
    local_38 = Attribute::make_attribute(pNVar15);
    local_68.first._M_string_length = (long)(int)_Var18;
    local_68.first._M_dataplus._M_p = (pointer)0x2;
    pNVar10 = internal::MetadataTree::get_child
                        (&this->sT->tree,&local_38,(Variant *)&local_68,pNVar10);
    this_00 = this->sT;
    local_68.first._0_16_ =
         cali_make_variant(CALI_TYPE_STRING,(name->_M_dataplus)._M_p,name->_M_string_length);
    pNVar10 = internal::MetadataTree::get_child
                        (&this_00->tree,&local_40,(Variant *)&local_68,pNVar10);
    __mutex = (pthread_mutex_t *)this->sG;
    iVar8 = pthread_mutex_lock(__mutex);
    if (iVar8 != 0) {
      std::__throw_system_error(iVar8);
    }
    pGVar1 = this->sG;
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Attribute>_>_>
            ::_M_lower_bound(&(pGVar1->attribute_map)._M_t,
                             (_Link_type)
                             (pGVar1->attribute_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent,
                             &(pGVar1->attribute_map)._M_t._M_impl.super__Rb_tree_header._M_header,
                             name);
    pGVar1 = this->sG;
    if ((((_Rb_tree_header *)iVar9._M_node ==
          &(pGVar1->attribute_map)._M_t._M_impl.super__Rb_tree_header) ||
        (__n = iVar9._M_node[1]._M_parent, __n != (_Base_ptr)name->_M_string_length)) ||
       ((__n != (_Base_ptr)0x0 &&
        (iVar8 = bcmp(*(void **)(iVar9._M_node + 1),(name->_M_dataplus)._M_p,(size_t)__n),
        iVar8 != 0)))) {
      local_78 = __mutex;
      AVar13 = Attribute::make_attribute(pNVar10);
      pcVar6 = (cali_variant_t *)&local_68.first.field_2;
      local_68.first._M_dataplus._M_p = (pointer)pcVar6;
      pcVar2 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
      local_68.second = AVar13;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::Attribute>,std::_Select1st<std::pair<std::__cxx11::string_const,cali::Attribute>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
      ::_M_emplace_hint_unique<std::pair<std::__cxx11::string,cali::Attribute>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::Attribute>,std::_Select1st<std::pair<std::__cxx11::string_const,cali::Attribute>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cali::Attribute>>>
                  *)&pGVar1->attribute_map,(const_iterator)iVar9._M_node,&local_68);
      if ((cali_variant_t *)local_68.first._M_dataplus._M_p != pcVar6) {
        operator_delete(local_68.first._M_dataplus._M_p,
                        local_68.first.field_2._M_allocated_capacity + 1);
      }
      pthread_mutex_unlock(local_78);
      local_80 = Attribute::make_attribute(pNVar10);
      pCVar16 = (this->sG->all_channels).
                super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar3 = (this->sG->all_channels).
               super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar16 != pCVar3) {
        do {
          local_68.first._M_dataplus._M_p = (pointer)this;
          util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
                    (&((pCVar16->mP).
                       super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      events,(Caliper **)&local_68,&local_80);
          pCVar16 = pCVar16 + 1;
        } while (pCVar16 != pCVar3);
      }
      goto LAB_001df95c;
    }
    local_80.m_node = *(Node **)(iVar9._M_node + 2);
  }
  else {
    local_80.m_node = *(Node **)(iVar9._M_node + 2);
  }
  pthread_mutex_unlock(__mutex);
LAB_001df95c:
  (local_70->lock).m_lock = (local_70->lock).m_lock + -1;
  return (Attribute)local_80.m_node;
}

Assistant:

Attribute Caliper::create_attribute(
    const std::string& name,
    cali_attr_type     type,
    int                prop,
    int                n_meta,
    const Attribute*   meta_attr,
    const Variant*     meta_val
)
{
    assert(sG != 0);

    std::lock_guard<::siglock> g(sT->lock);

    // Check if an attribute with this name already exists
    {
        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.find(name);
        if (it != sG->attribute_map.end())
            return it->second;
    }

    Node* node = nullptr;

    // Get type node
    node = sT->tree.type_node(type);

    // Add metadata nodes.
    for (int n = 0; n < n_meta; ++n)
        node = sT->tree.get_child(meta_attr[n], meta_val[n], node);

    // Look for attribute properties in presets
    auto propit = sG->attribute_prop_presets.find(name);
    if (propit != sG->attribute_prop_presets.end())
        prop = propit->second;

    // Set scope to PROCESS for all global attributes and mark them as unaligned
    if (prop & CALI_ATTR_GLOBAL) {
        prop &= ~CALI_ATTR_SCOPE_MASK;
        prop |= CALI_ATTR_SCOPE_PROCESS;
        prop |= CALI_ATTR_UNALIGNED;
    }
    // Set scope to default scope if none is set
    if ((prop & CALI_ATTR_SCOPE_MASK) == 0)
        prop |= sG->attribute_default_scope;

    // Set CALI_ATTR_AGGREGATABLE property if class.aggregatable metadata is set
    for (const Node* tmp = node; tmp; tmp = tmp->parent())
        if (tmp->attribute() == cali_class_aggregatable_attr_id && tmp->data() == Variant(true)) {
            prop |= CALI_ATTR_AGGREGATABLE;
            break;
        }

    Attribute name_attr = Attribute::make_attribute(sT->tree.node(Attribute::NAME_ATTR_ID));
    Attribute prop_attr = Attribute::make_attribute(sT->tree.node(Attribute::PROP_ATTR_ID));

    node = sT->tree.get_child(prop_attr, Variant(prop), node);
    node = sT->tree.get_child(name_attr, Variant(CALI_TYPE_STRING, name.data(), name.size()), node);

    {
        // Check again if attribute already exists; might have been created by
        // another thread in the meantime.
        // We've created some redundant nodes then, but that's fine

        std::lock_guard<std::mutex> ga(sG->attribute_lock);

        auto it = sG->attribute_map.lower_bound(name);

        if (it == sG->attribute_map.end() || it->first != name)
            sG->attribute_map.insert(it, std::make_pair(name, Attribute::make_attribute(node)));
        else
            return it->second;
    }

    // Create attribute object

    Attribute attr = Attribute::make_attribute(node);

    for (auto& channel : sG->all_channels)
        channel.mP->events.create_attr_evt(this, attr);

    return attr;
}